

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_24e5871::ObmcVarianceTest_ExtremeValues_Test::TestBody
          (ObmcVarianceTest_ExtremeValues_Test *this)

{
  undefined8 *puVar1;
  ObmcVarianceTest_ExtremeValues_Test *pOVar2;
  bool bVar3;
  long lVar4;
  SEARCH_METHODS *pSVar5;
  int iVar6;
  undefined2 in_FPUControlWord;
  undefined2 in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  uint tst_res;
  uint ref_res;
  uint ref_sse;
  RegisterStateCheckMMX reg_check_mmx;
  uint tst_sse;
  uint8_t pre [16384];
  int32_t mask [16384];
  int32_t wsrc [16384];
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_240b0;
  AssertHelper AStack_240a8;
  uint uStack_2409c;
  uint uStack_24098;
  uint uStack_24094;
  internal aiStack_24090 [8];
  undefined2 uStack_24088;
  undefined2 uStack_24086;
  undefined4 uStack_24084;
  undefined2 uStack_24080;
  ObmcVarianceTest_ExtremeValues_Test *pOStack_24070;
  uint uStack_24064;
  uchar auStack_24060 [16384];
  int aiStack_20060 [32780];
  
  iVar6 = 0;
  pOStack_24070 = this;
  while( true ) {
    bVar3 = testing::Test::HasFatalFailure();
    if (bVar3) {
      return;
    }
    memset(auStack_24060,0xff,0x4000);
    pOVar2 = pOStack_24070;
    lVar4 = 0;
    do {
      aiStack_20060[lVar4 + 0x4000] = 0xff000;
      aiStack_20060[lVar4 + 0x4001] = 0xff000;
      aiStack_20060[lVar4 + 0x4002] = 0xff000;
      aiStack_20060[lVar4 + 0x4003] = 0xff000;
      aiStack_20060[lVar4] = 0x1000;
      aiStack_20060[lVar4 + 1] = 0x1000;
      aiStack_20060[lVar4 + 2] = 0x1000;
      aiStack_20060[lVar4 + 3] = 0x1000;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x4000);
    uStack_24098 = (*(pOStack_24070->super_ObmcVarianceTest).
                     super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
                     .params_.ref_func)
                             (auStack_24060,iVar6,aiStack_20060 + 0x4000,aiStack_20060,&uStack_24094
                             );
    aiStack_24090[0] = SUB21(in_FPUControlWord,0);
    uStack_24084 = (undefined4)in_FPUInstructionPointer;
    uStack_24080 = (undefined2)((ulong)in_FPUInstructionPointer >> 0x20);
    uStack_24088 = in_FPUTagWord;
    uStack_2409c = (*(pOVar2->super_ObmcVarianceTest).
                     super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
                     .params_.tst_func)
                             (auStack_24060,iVar6,aiStack_20060 + 0x4000,aiStack_20060,&uStack_24064
                             );
    libaom_test::RegisterStateCheckMMX::Check((RegisterStateCheckMMX *)aiStack_24090);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (aiStack_24090,"ref_res","tst_res",&uStack_24098,&uStack_2409c);
    if (aiStack_24090[0] == (internal)0x0) break;
    puVar1 = (undefined8 *)CONCAT44(uStack_24084,CONCAT22(uStack_24086,uStack_24088));
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (aiStack_24090,"ref_sse","tst_sse",&uStack_24094,&uStack_24064);
    if (aiStack_24090[0] == (internal)0x0) {
      testing::Message::Message((Message *)&_Stack_240b0);
      puVar1 = (undefined8 *)CONCAT44(uStack_24084,CONCAT22(uStack_24086,uStack_24088));
      if (puVar1 == (undefined8 *)0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_240a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/obmc_variance_test.cc"
                 ,0x5d,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&AStack_240a8,(Message *)&_Stack_240b0);
      goto LAB_00799579;
    }
    puVar1 = (undefined8 *)CONCAT44(uStack_24084,CONCAT22(uStack_24086,uStack_24088));
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
    iVar6 = iVar6 + 1;
    if (iVar6 == 0x80) {
      return;
    }
  }
  testing::Message::Message((Message *)&_Stack_240b0);
  puVar1 = (undefined8 *)CONCAT44(uStack_24084,CONCAT22(uStack_24086,uStack_24088));
  if (puVar1 == (undefined8 *)0x0) {
    pSVar5 = "";
  }
  else {
    pSVar5 = (SEARCH_METHODS *)*puVar1;
  }
  testing::internal::AssertHelper::AssertHelper
            (&AStack_240a8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/obmc_variance_test.cc"
             ,0x5c,(char *)pSVar5);
  testing::internal::AssertHelper::operator=(&AStack_240a8,(Message *)&_Stack_240b0);
LAB_00799579:
  testing::internal::AssertHelper::~AssertHelper(&AStack_240a8);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )_Stack_240b0._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)_Stack_240b0._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  puVar1 = (undefined8 *)CONCAT44(uStack_24084,CONCAT22(uStack_24086,uStack_24088));
  if (puVar1 == (undefined8 *)0x0) {
    return;
  }
  if ((undefined8 *)*puVar1 != puVar1 + 2) {
    operator_delete((undefined8 *)*puVar1);
  }
  operator_delete(puVar1);
  return;
}

Assistant:

TEST_P(ObmcVarianceTest, ExtremeValues) {
  DECLARE_ALIGNED(32, uint8_t, pre[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, wsrc[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, mask[MAX_SB_SQUARE]);

  for (int iter = 0; iter < MAX_SB_SIZE && !HasFatalFailure(); ++iter) {
    const int pre_stride = iter;

    for (int i = 0; i < MAX_SB_SQUARE; ++i) {
      pre[i] = UINT8_MAX;
      wsrc[i] = UINT8_MAX * kMaskMax * kMaskMax;
      mask[i] = kMaskMax * kMaskMax;
    }

    unsigned int ref_sse, tst_sse;
    const unsigned int ref_res =
        params_.ref_func(pre, pre_stride, wsrc, mask, &ref_sse);
    unsigned int tst_res;
    API_REGISTER_STATE_CHECK(
        tst_res = params_.tst_func(pre, pre_stride, wsrc, mask, &tst_sse));

    ASSERT_EQ(ref_res, tst_res);
    ASSERT_EQ(ref_sse, tst_sse);
  }
}